

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtable.cpp
# Opt level: O1

void __thiscall YAJLQTable::YAJLQTable(YAJLQTable *this,bitio_stream *bstream)

{
  u8 uVar1;
  int iVar2;
  u16 *puVar3;
  ssize_t sVar4;
  u16 *in_RCX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  void *extraout_RDX_00;
  long lVar5;
  
  puVar3 = (u16 *)operator_new__(0x80);
  this->coeffs = puVar3;
  sVar4 = bitio::bitio_stream::read(bstream,4,__buf,(size_t)in_RCX);
  this->precision = (u8)sVar4;
  sVar4 = bitio::bitio_stream::read(bstream,4,__buf_00,(size_t)in_RCX);
  this->dest_id = (u8)sVar4;
  uVar1 = this->precision;
  lVar5 = 0;
  __buf_01 = extraout_RDX;
  do {
    iVar2 = *(int *)((long)&scanorders::ZZ + lVar5);
    sVar4 = bitio::bitio_stream::read
                      (bstream,(uint)(byte)((uVar1 != '\0') * '\b' + 8),__buf_01,(size_t)in_RCX);
    in_RCX = this->coeffs;
    in_RCX[iVar2] = (u16)sVar4;
    lVar5 = lVar5 + 4;
    __buf_01 = extraout_RDX_00;
  } while (lVar5 != 0x100);
  return;
}

Assistant:

YAJLQTable::YAJLQTable(bitio::bitio_stream *bstream) {
    coeffs = new u16[0x40];
    precision = bstream->read(0x4);
    dest_id = bstream->read(0x4);
    uint8_t qk_size = precision == 0 ? 8 : 16;
    for (int i : scanorders::ZZ) {
        coeffs[i] = bstream->read(qk_size);
    }
}